

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall sznet::net::Connector::handleWrite(Connector *this)

{
  bool bVar1;
  LogLevel LVar2;
  LogStream *pLVar3;
  self *psVar4;
  char *str;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  undefined1 local_2fc8 [12];
  Logger local_2fb8;
  undefined1 local_1fe8 [12];
  Logger local_1fd8;
  int local_1004;
  sz_sock local_1000;
  int err;
  sz_sock sockfd;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  Connector *local_10;
  Connector *this_local;
  
  local_10 = this;
  LVar2 = Logger::logLevel();
  if ((int)LVar2 < 1) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_ff0,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff0._0_8_;
    file.m_size = local_ff0._8_4_;
    Logger::Logger(&local_fe0,file,0xa2,TRACE,"handleWrite");
    pLVar3 = Logger::stream(&local_fe0);
    psVar4 = LogStream::operator<<(pLVar3,"Connector::handleWrite ");
    LogStream::operator<<(psVar4,this->m_state);
    Logger::~Logger(&local_fe0);
  }
  if (this->m_state == kConnecting) {
    local_1000 = removeAndResetChannel(this);
    local_1004 = sockets::sz_sock_geterror(local_1000);
    if (local_1004 == 0) {
      bVar1 = sockets::sz_sock_isselfconnect(local_1000);
      if (bVar1) {
        Logger::SourceFile::SourceFile<100>
                  ((SourceFile *)local_2fc8,
                   (char (*) [100])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                  );
        file_01._12_4_ = 0;
        file_01.m_data = (char *)local_2fc8._0_8_;
        file_01.m_size = local_2fc8._8_4_;
        Logger::Logger(&local_2fb8,file_01,0xb2,WARN);
        pLVar3 = Logger::stream(&local_2fb8);
        LogStream::operator<<(pLVar3,"Connector::handleWrite - Self connect");
        Logger::~Logger(&local_2fb8);
        retry(this,local_1000);
      }
      else {
        setState(this,kConnected);
        if ((this->m_connect & 1U) == 0) {
          sockets::sz_closesocket(local_1000);
        }
        else {
          std::function<void_(int)>::operator()(&this->m_newConnectionCallback,local_1000);
        }
      }
    }
    else {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_1fe8,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_1fe8._0_8_;
      file_00.m_size = local_1fe8._8_4_;
      Logger::Logger(&local_1fd8,file_00,0xaa,WARN);
      pLVar3 = Logger::stream(&local_1fd8);
      psVar4 = LogStream::operator<<(pLVar3,"Connector::handleWrite - SO_ERROR = ");
      pLVar3 = LogStream::operator<<(psVar4,local_1004);
      psVar4 = LogStream::operator<<(pLVar3," ");
      str = sz_strerror_tl(local_1004);
      LogStream::operator<<(psVar4,str);
      Logger::~Logger(&local_1fd8);
      retry(this,local_1000);
    }
  }
  else if (this->m_state != kDisconnected) {
    __assert_fail("m_state == kDisconnected",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                  ,0xc6,"void sznet::net::Connector::handleWrite()");
  }
  return;
}

Assistant:

void Connector::handleWrite()
{
	LOG_TRACE << "Connector::handleWrite " << m_state;

	if (m_state == kConnecting)
	{
		sockets::sz_sock sockfd = removeAndResetChannel();
		int err = sockets::sz_sock_geterror(sockfd);
		if (err)
		{
			LOG_WARN << "Connector::handleWrite - SO_ERROR = "
				<< err << " " << sz_strerror_tl(err);
			retry(sockfd);
		}
		else if (sockets::sz_sock_isselfconnect(sockfd))
		{
			// ���������ӣ���(source IP, source port) = (destination IP, destination port)
			// ������ʽ���ǳ�����������
			LOG_WARN << "Connector::handleWrite - Self connect";
			retry(sockfd);
		}
		else
		{
			// ���ӳɹ�
			setState(kConnected);
			if (m_connect)
			{
				m_newConnectionCallback(sockfd);
			}
			else
			{
				sockets::sz_closesocket(sockfd);
			}
		}
	}
	else
	{
		// what happened?
		assert(m_state == kDisconnected);
	}
}